

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

uint16_t TIFFFetchDirectory(TIFF *tif,uint64_t diroff,TIFFDirEntry **pdir,uint64_t *nextdiroff)

{
  toff_t off;
  int iVar1;
  uint uVar2;
  tmsize_t tVar3;
  uint16_t *wp;
  ulong uVar4;
  TIFFDirEntry *pTVar5;
  long lVar6;
  char *fmt;
  char *pcVar7;
  ushort uVar8;
  tmsize_t tStack_60;
  uint16_t dircount16;
  uint64_t dircount64;
  uint16_t *local_40;
  TIFFDirEntry *local_38;
  
  if (pdir == (TIFFDirEntry **)0x0) {
    __assert_fail("pdir",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x167a,
                  "uint16_t TIFFFetchDirectory(TIFF *, uint64_t, TIFFDirEntry **, uint64_t *)");
  }
  tif->tif_diroff = diroff;
  if (nextdiroff != (uint64_t *)0x0) {
    *nextdiroff = 0;
  }
  off = tif->tif_diroff;
  if ((tif->tif_flags >> 0xb & 1) == 0) {
    iVar1 = _TIFFSeekOK(tif,off);
    if (iVar1 == 0) {
      pcVar7 = tif->tif_name;
      fmt = "%s: Seek error accessing TIFF directory";
    }
    else {
      if ((tif->tif_flags & 0x80000) != 0) {
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&dircount64,8);
        if (tVar3 != 8) {
          TIFFErrorExtR(tif,"TIFFFetchDirectory","%s: Can not read TIFF directory count",
                        tif->tif_name);
          return 0;
        }
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(&dircount64);
        }
        uVar4 = CONCAT44(dircount64._4_4_,(uint)dircount64);
        if (0x1000 < uVar4) {
LAB_0024e5ef:
          pcVar7 = "Sanity check on directory count failed, this is probably not a valid IFD offset"
          ;
LAB_0024e5fd:
          TIFFErrorExtR(tif,"TIFFFetchDirectory",pcVar7);
          return 0;
        }
        dircount16 = (uint16_t)(uint)dircount64;
        tStack_60 = 0x14;
LAB_0024e474:
        wp = (uint16_t *)_TIFFCheckMalloc(tif,uVar4 & 0xffff,tStack_60,"to read TIFF directory");
        if (wp == (uint16_t *)0x0) {
          return 0;
        }
        uVar4 = (*tif->tif_readproc)(tif->tif_clientdata,wp,(ulong)dircount16 * (long)tStack_60);
        if (uVar4 != (uint)dircount16 * (int)tStack_60) {
          TIFFErrorExtR(tif,"TIFFFetchDirectory","%.100s: Can not read TIFF directory",tif->tif_name
                       );
          goto LAB_0024e6aa;
        }
        if (nextdiroff == (uint64_t *)0x0) goto LAB_0024e7b2;
        if ((tif->tif_flags & 0x80000) == 0) {
          tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&dircount64,4);
          if (tVar3 != 4) {
            dircount64._0_4_ = 0;
          }
          if ((tif->tif_flags & 0x80) != 0) {
LAB_0024e4f7:
            TIFFSwabLong((uint32_t *)&dircount64);
          }
LAB_0024e501:
          *nextdiroff = (ulong)(uint)dircount64;
          goto LAB_0024e7b2;
        }
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,nextdiroff,8);
        if (tVar3 != 8) {
          *nextdiroff = 0;
        }
        if ((tif->tif_flags & 0x80) == 0) goto LAB_0024e7b2;
LAB_0024e7aa:
        TIFFSwabLong8(nextdiroff);
LAB_0024e7b2:
        pTVar5 = (TIFFDirEntry *)
                 _TIFFCheckMalloc(tif,(ulong)dircount16,0x20,"to read TIFF directory");
        if (pTVar5 == (TIFFDirEntry *)0x0) {
          _TIFFfreeExt(tif,wp);
          return 0;
        }
        local_40 = wp;
        local_38 = pTVar5;
        for (uVar8 = 0; uVar8 < dircount16; uVar8 = uVar8 + 1) {
          pTVar5->tdir_ignore = '\0';
          uVar2 = tif->tif_flags;
          if ((char)uVar2 < '\0') {
            TIFFSwabShort(wp);
            uVar2 = tif->tif_flags;
            pTVar5->tdir_tag = *wp;
            if ((char)uVar2 < '\0') {
              TIFFSwabShort(wp + 1);
              uVar2 = tif->tif_flags;
            }
          }
          else {
            pTVar5->tdir_tag = *wp;
          }
          pTVar5->tdir_type = wp[1];
          if ((uVar2 >> 0x13 & 1) == 0) {
            if ((char)uVar2 < '\0') {
              TIFFSwabLong((uint32_t *)(wp + 2));
            }
            pTVar5->tdir_count = (ulong)*(uint *)(wp + 2);
            (pTVar5->tdir_offset).toff_long8 = 0;
            (pTVar5->tdir_offset).toff_long = *(uint32_t *)(wp + 4);
            lVar6 = 0xc;
          }
          else {
            if ((char)uVar2 < '\0') {
              TIFFSwabLong8((uint64_t *)(wp + 2));
            }
            pTVar5->tdir_count = *(uint64_t *)(wp + 2);
            pTVar5->tdir_offset = *(anon_union_8_3_50a3d880_for_tdir_offset *)(wp + 6);
            lVar6 = 0x14;
          }
          wp = (uint16_t *)((long)wp + lVar6);
          pTVar5 = pTVar5 + 1;
        }
        _TIFFfreeExt(tif,local_40);
        *pdir = local_38;
        return dircount16;
      }
      tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&dircount16,2);
      if (tVar3 == 2) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabShort(&dircount16);
        }
        uVar4 = (ulong)dircount16;
        if (dircount16 < 0x1001) {
          tStack_60 = 0xc;
          goto LAB_0024e474;
        }
LAB_0024e5ab:
        pcVar7 = "Sanity check on directory count failed, this is probably not a valid IFD offset";
        goto LAB_0024e406;
      }
      pcVar7 = tif->tif_name;
      fmt = "%s: Can not read TIFF directory count";
    }
    TIFFErrorExtR(tif,"TIFFFetchDirectory",fmt,pcVar7);
  }
  else {
    if ((long)off < 0) {
LAB_0024e3f8:
      pcVar7 = "Can not read TIFF directory count";
    }
    else {
      if ((tif->tif_flags >> 0x13 & 1) == 0) {
        if ((0x7ffffffffffffffd < off) || (lVar6 = off + 2, tif->tif_size < lVar6))
        goto LAB_0024e3f8;
        _TIFFmemcpy(&dircount16,tif->tif_base + off,2);
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabShort(&dircount16);
        }
        uVar4 = (ulong)dircount16;
        if (0x1000 < dircount16) goto LAB_0024e5ab;
        tVar3 = 0xc;
      }
      else {
        if ((0x7ffffffffffffff7 < off) || (lVar6 = off + 8, tif->tif_size < lVar6)) {
          pcVar7 = "Can not read TIFF directory count";
          goto LAB_0024e5fd;
        }
        _TIFFmemcpy(&dircount64,tif->tif_base + off,8);
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(&dircount64);
        }
        uVar4 = CONCAT44(dircount64._4_4_,(uint)dircount64);
        if (0x1000 < uVar4) goto LAB_0024e5ef;
        tVar3 = 0x14;
        dircount16 = (uint16_t)(uint)dircount64;
      }
      if ((short)uVar4 != 0) {
        local_40 = (uint16_t *)_TIFFCheckMalloc(tif,uVar4 & 0xffff,tVar3,"to read TIFF directory");
        if (local_40 == (uint16_t *)0x0) {
          return 0;
        }
        uVar4 = (ulong)((uint)dircount16 * (int)tVar3);
        if (tif->tif_size < (long)(uVar4 + lVar6)) {
          TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory");
          wp = local_40;
LAB_0024e6aa:
          _TIFFfreeExt(tif,wp);
          return 0;
        }
        _TIFFmemcpy(local_40,tif->tif_base + lVar6,uVar4);
        wp = local_40;
        if (nextdiroff == (uint64_t *)0x0) goto LAB_0024e7b2;
        uVar4 = lVar6 + (ulong)((int)tVar3 * (uint)dircount16);
        uVar2 = tif->tif_flags;
        if ((uVar2 >> 0x13 & 1) == 0) {
          if ((uVar4 < 0x7ffffffffffffffc) && ((long)(uVar4 + 4) <= tif->tif_size)) {
            _TIFFmemcpy(&dircount64,tif->tif_base + uVar4,4);
            uVar2 = tif->tif_flags;
          }
          else {
            dircount64._0_4_ = 0;
          }
          wp = local_40;
          if ((char)uVar2 < '\0') goto LAB_0024e4f7;
          goto LAB_0024e501;
        }
        if ((uVar4 < 0x7ffffffffffffff8) && ((long)(uVar4 + 8) <= tif->tif_size)) {
          _TIFFmemcpy(nextdiroff,tif->tif_base + uVar4,8);
          uVar2 = tif->tif_flags;
        }
        else {
          *nextdiroff = 0;
        }
        wp = local_40;
        if (-1 < (char)uVar2) goto LAB_0024e7b2;
        goto LAB_0024e7aa;
      }
      pcVar7 = "Sanity check on directory count failed, zero tag directories not supported";
    }
LAB_0024e406:
    TIFFErrorExtR(tif,"TIFFFetchDirectory",pcVar7);
  }
  return 0;
}

Assistant:

static uint16_t TIFFFetchDirectory(TIFF *tif, uint64_t diroff,
                                   TIFFDirEntry **pdir, uint64_t *nextdiroff)
{
    static const char module[] = "TIFFFetchDirectory";

    void *origdir;
    uint16_t dircount16;
    uint32_t dirsize;
    TIFFDirEntry *dir;
    uint8_t *ma;
    TIFFDirEntry *mb;
    uint16_t n;

    assert(pdir);

    tif->tif_diroff = diroff;
    if (nextdiroff)
        *nextdiroff = 0;
    if (!isMapped(tif))
    {
        if (!SeekOK(tif, tif->tif_diroff))
        {
            TIFFErrorExtR(tif, module,
                          "%s: Seek error accessing TIFF directory",
                          tif->tif_name);
            return 0;
        }
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (!ReadOK(tif, &dircount16, sizeof(uint16_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            if (!ReadOK(tif, &dircount64, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        if (!ReadOK(tif, origdir, (tmsize_t)(dircount16 * dirsize)))
        {
            TIFFErrorExtR(tif, module, "%.100s: Can not read TIFF directory",
                          tif->tif_name);
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        /*
         * Read offset to next directory for sequential scans if
         * needed.
         */
        if (nextdiroff)
        {
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                if (!ReadOK(tif, &nextdiroff32, sizeof(uint32_t)))
                    nextdiroff32 = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                if (!ReadOK(tif, nextdiroff, sizeof(uint64_t)))
                    *nextdiroff = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    else
    {
        tmsize_t m;
        tmsize_t off;
        if (tif->tif_diroff > (uint64_t)INT64_MAX)
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
            return (0);
        }
        off = (tmsize_t)tif->tif_diroff;

        /*
         * Check for integer overflow when validating the dir_off,
         * otherwise a very high offset may cause an OOB read and
         * crash the client. Make two comparisons instead of
         *
         *  off + sizeof(uint16_t) > tif->tif_size
         *
         * to avoid overflow.
         */
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            m = off + sizeof(uint16_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint16_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount16, tif->tif_base + off, sizeof(uint16_t));
            }
            off += sizeof(uint16_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            m = off + sizeof(uint64_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount64, tif->tif_base + off, sizeof(uint64_t));
            }
            off += sizeof(uint64_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        if (dircount16 == 0)
        {
            TIFFErrorExtR(tif, module,
                          "Sanity check on directory count failed, zero tag "
                          "directories not supported");
            return 0;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        m = off + dircount16 * dirsize;
        if ((m < off) || (m < (tmsize_t)(dircount16 * dirsize)) ||
            (m > tif->tif_size))
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory");
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        else
        {
            _TIFFmemcpy(origdir, tif->tif_base + off, dircount16 * dirsize);
        }
        if (nextdiroff)
        {
            off += dircount16 * dirsize;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                m = off + sizeof(uint32_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint32_t)) ||
                    (m > tif->tif_size))
                    nextdiroff32 = 0;
                else
                    _TIFFmemcpy(&nextdiroff32, tif->tif_base + off,
                                sizeof(uint32_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                m = off + sizeof(uint64_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                    (m > tif->tif_size))
                    *nextdiroff = 0;
                else
                    _TIFFmemcpy(nextdiroff, tif->tif_base + off,
                                sizeof(uint64_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    dir = (TIFFDirEntry *)_TIFFCheckMalloc(
        tif, dircount16, sizeof(TIFFDirEntry), "to read TIFF directory");
    if (dir == 0)
    {
        _TIFFfreeExt(tif, origdir);
        return 0;
    }
    ma = (uint8_t *)origdir;
    mb = dir;
    for (n = 0; n < dircount16; n++)
    {
        mb->tdir_ignore = FALSE;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_tag = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_type = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong((uint32_t *)ma);
            mb->tdir_count = (uint64_t)(*(uint32_t *)ma);
            ma += sizeof(uint32_t);
            mb->tdir_offset.toff_long8 = 0;
            *(uint32_t *)(&mb->tdir_offset) = *(uint32_t *)ma;
            ma += sizeof(uint32_t);
        }
        else
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8((uint64_t *)ma);
            mb->tdir_count = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
            mb->tdir_offset.toff_long8 = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
        }
        mb++;
    }
    _TIFFfreeExt(tif, origdir);
    *pdir = dir;
    return dircount16;
}